

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod.c
# Opt level: O0

int main(int argc,char **argv)

{
  __pid_t _Var1;
  int iVar2;
  uint uVar3;
  int flags;
  pid_t pid;
  int in_stack_00000014;
  
  initOpts(in_stack_00000014,argv);
  if (foreground == 0) {
    _Var1 = fork();
    if (_Var1 < 0) {
      exit(1);
    }
    if (0 < _Var1) {
      exit(0);
    }
    umask(0);
    _Var1 = setsid();
    if (_Var1 < 0) {
      fatal("setsid failed (%m)");
    }
    iVar2 = chdir("/");
    if (iVar2 < 0) {
      fatal("chdir failed (%m)");
    }
    fclose(_stdin);
    fclose(_stdout);
  }
  gpioCfgBufferSize(bufferSizeMilliseconds);
  gpioCfgClock(clockMicros,clockPeripheral,0);
  gpioCfgInterfaces(ifFlags);
  gpioCfgDMAchannels(DMAprimaryChannel,DMAsecondaryChannel);
  gpioCfgSocketPort(socketPort);
  gpioCfgMemAlloc(memAllocMode);
  if (updateMaskSet != 0) {
    gpioCfgPermissions(updateMask);
  }
  gpioCfgNetAddr(numSockNetAddr,sockNetAddr);
  gpioCfgSetInternals(cfgInternals);
  iVar2 = gpioInitialise();
  if (iVar2 < 0) {
    fatal("Can\'t initialise pigpio library");
  }
  unlink("/dev/pigerr");
  mkfifo("/dev/pigerr",0x1b4);
  iVar2 = chmod("/dev/pigerr",0x1b4);
  if (iVar2 < 0) {
    fatal("chmod %s failed (%m)","/dev/pigerr");
  }
  errFifo = (FILE *)freopen("/dev/pigerr","w+",_stderr);
  if ((FILE *)errFifo != (FILE *)0x0) {
    iVar2 = fileno((FILE *)errFifo);
    uVar3 = fcntl(iVar2,3,0);
    iVar2 = fileno((FILE *)errFifo);
    fcntl(iVar2,4,(ulong)(uVar3 | 0x800));
    gpioSetSignalFunc(1,terminate);
    gpioSetSignalFunc(0xf,terminate);
    do {
      sleep(5);
      fflush((FILE *)errFifo);
    } while( true );
  }
  fprintf(_stderr,"freopen failed (%m)");
  gpioTerminate();
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
   pid_t pid;
   int flags;

   /* check command line parameters */

   initOpts(argc, argv);

   if (!foreground) {
      /* Fork off the parent process */

      pid = fork();

      if (pid < 0) { exit(EXIT_FAILURE); }

      /* If we got a good PID, then we can exit the parent process. */

      if (pid > 0) { exit(EXIT_SUCCESS); }

      /* Change the file mode mask */

      umask(0);

      /* Open any logs here */

      /* NONE */

      /* Create a new SID for the child process */

      if (setsid() < 0) fatal("setsid failed (%m)");

      /* Change the current working directory */

      if ((chdir("/")) < 0) fatal("chdir failed (%m)");

      /* Close out the standard file descriptors */

      fclose(stdin);
      fclose(stdout);
   }

   /* configure library */

   gpioCfgBufferSize(bufferSizeMilliseconds);

   gpioCfgClock(clockMicros, clockPeripheral, 0);

   gpioCfgInterfaces(ifFlags);

   gpioCfgDMAchannels(DMAprimaryChannel, DMAsecondaryChannel);

   gpioCfgSocketPort(socketPort);

   gpioCfgMemAlloc(memAllocMode);

   if (updateMaskSet) gpioCfgPermissions(updateMask);

   gpioCfgNetAddr(numSockNetAddr, sockNetAddr);

   gpioCfgSetInternals(cfgInternals);

   /* start library */

   if (gpioInitialise()< 0) fatal("Can't initialise pigpio library");

   /* create pipe for error reporting */

   unlink(PI_ERRFIFO);

   mkfifo(PI_ERRFIFO, 0664);

   if (chmod(PI_ERRFIFO, 0664) < 0)
      fatal("chmod %s failed (%m)", PI_ERRFIFO);

   errFifo = freopen(PI_ERRFIFO, "w+", stderr);

   if (errFifo)
   {
      /* set stderr non-blocking */

      flags = fcntl(fileno(errFifo), F_GETFL, 0);
      fcntl(fileno(errFifo), F_SETFL, flags | O_NONBLOCK);

      /* request SIGHUP/SIGTERM from libarary for termination */

      gpioSetSignalFunc(SIGHUP, terminate);
      gpioSetSignalFunc(SIGTERM, terminate);

      /* sleep forever */

      while (1)
      {
         /* cat /dev/pigerr to view daemon errors */

         sleep(5);

         fflush(errFifo);
      }
   }
   else
   {
      fprintf(stderr, "freopen failed (%m)");

      gpioTerminate();
   }

   return 0;
}